

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

size_t __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::decoder_strategy>
::decode_scan(jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::decoder_strategy>
              *this,unique_ptr<charls::process_line,_std::default_delete<charls::process_line>_>
                    *process_line,JlsRect *rect,const_byte_span encoded_source)

{
  const_byte_span source;
  int32_t iVar1;
  iterator puVar2;
  frame_info *pfVar3;
  uint8_t *puVar4;
  uint8_t *scan_begin;
  JlsRect *rect_local;
  unique_ptr<charls::process_line,_std::default_delete<charls::process_line>_> *process_line_local;
  jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::decoder_strategy>
  *this_local;
  const_byte_span encoded_source_local;
  
  encoded_source_local.data_ = (uint8_t *)encoded_source.size_;
  this_local = (jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::decoder_strategy>
                *)encoded_source.data_;
  std::unique_ptr<charls::process_line,_std::default_delete<charls::process_line>_>::operator=
            (&(this->super_decoder_strategy).process_line_,process_line);
  puVar2 = const_byte_span::begin((const_byte_span *)&this_local);
  iVar1 = rect->Y;
  (this->rect_).X = rect->X;
  (this->rect_).Y = iVar1;
  iVar1 = rect->Height;
  (this->rect_).Width = rect->Width;
  (this->rect_).Height = iVar1;
  source.size_ = (size_t)encoded_source_local.data_;
  source.data_ = (uint8_t *)this_local;
  decoder_strategy::initialize(&this->super_decoder_strategy,source);
  if (this->restart_interval_ == 0) {
    pfVar3 = frame_info(this);
    this->restart_interval_ = pfVar3->height;
  }
  decode_lines(this);
  puVar4 = decoder_strategy::get_cur_byte_pos(&this->super_decoder_strategy);
  return (long)puVar4 - (long)puVar2;
}

Assistant:

size_t decode_scan(std::unique_ptr<process_line> process_line, const JlsRect& rect, const_byte_span encoded_source)
    {
        Strategy::process_line_ = std::move(process_line);

        const auto* scan_begin{encoded_source.begin()};
        rect_ = rect;

        Strategy::initialize(encoded_source);

        // Process images without a restart interval, as 1 large restart interval.
        if (restart_interval_ == 0)
        {
            restart_interval_ = frame_info().height;
        }

        decode_lines();

        return Strategy::get_cur_byte_pos() - scan_begin;
    }